

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O3

boolean ghitm(monst *mtmp,obj *gold)

{
  short sVar1;
  permonst *ppVar2;
  boolean bVar3;
  schar sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  long lVar15;
  
  if (((((mtmp->data == mons + 0xdb) && ((mtmp->field_0x61 & 1) == 0)) && (6 < mtmp->mhp)) &&
      ((objects[gold->otyp].oc_oprop != '\x04' && (bVar3 = obj_resists(gold,5,0x32), bVar3 == '\0'))
      )) && (bVar3 = is_quest_artifact(gold), bVar3 == '\0')) {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      pcVar11 = xname(gold);
      pcVar9 = xname(gold);
      pcVar9 = vtense(pcVar9,"disintegrate");
      pline("The %s %s!",pcVar11,pcVar9);
    }
    dealloc_obj(gold);
    return '\x01';
  }
  uVar5 = mtmp->data->mflags2;
  uVar7 = *(uint *)&mtmp->field_0x60;
  if (((uVar5 >> 0x1c & 1) == 0) && ((uVar5 >> 10 & 1) == 0 && (uVar7 & 0x12000000) == 0)) {
    wakeup(mtmp);
    goto LAB_00176bcc;
  }
  if ((uVar7 >> 0x12 & 1) != 0) {
    iVar6 = gold->quan;
    sVar1 = objects[gold->otyp].oc_cost;
    *(uint *)&mtmp->field_0x60 = uVar7 & 0xfff7ffff;
    mtmp->meating = 0;
    uVar5 = mt_random();
    if ((uVar5 & 3) == 0) {
      setmangry(mtmp);
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
      pcVar11 = Monnam(mtmp);
      pline("%s catches the gold.",pcVar11);
    }
    lVar15 = (long)iVar6 * (long)sVar1;
    uVar5 = *(uint *)&mtmp->field_0x60;
    if ((uVar5 >> 0x19 & 1) == 0) {
      if ((uVar5 >> 0x1c & 1) == 0) {
        if ((mtmp->data->mflags2 & 0x400) == 0) goto LAB_00176ce8;
        uVar5 = mt_random();
        if (0x55555555 < uVar5 * -0x55555555) {
          ppVar2 = mtmp->data;
          if (ppVar2 == mons + 0x121) {
            lVar8 = 100;
          }
          else if (ppVar2 == mons + 0x122) {
            lVar8 = 0xfa;
          }
          else if (ppVar2 == mons + 0x123) {
            lVar8 = 500;
          }
          else if (ppVar2 == mons + 0x124) {
            lVar8 = 0x2ee;
          }
          else {
            if (ppVar2 != mons + 0x10d) goto LAB_00176cca;
            lVar8 = 200;
          }
          lVar12 = money_cnt(invent);
          lVar13 = (long)u.ulevel;
          uVar5 = mt_random();
          sVar4 = acurr(5);
          if ((long)((ulong)(uVar5 % 5) * lVar13 + lVar12) / (long)sVar4 + lVar8 < lVar15) {
            mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
          }
        }
LAB_00176cca:
        if ((mtmp->field_0x62 & 0x40) == 0) {
          pcVar11 = "That\'s not enough, coward!";
        }
        else {
          pcVar11 = "That should do.  Now beat it!";
        }
      }
      else {
        if ((uVar5 >> 0x16 & 1) == 0) goto LAB_00176aa1;
        pcVar11 = "Thank you for your contribution.";
      }
    }
    else {
      iVar6._0_1_ = mtmp[0x1b].mtame;
      iVar6._1_1_ = mtmp[0x1b].m_ap_type;
      iVar6._2_1_ = mtmp[0x1b].mfrozen;
      iVar6._3_1_ = mtmp[0x1b].mblinded;
      if ((long)iVar6 != 0) {
        lVar15 = iVar6 - lVar15;
        pcVar11 = "partially ";
        if (lVar15 < 1) {
          pcVar11 = "";
        }
        iVar6 = pronoun_gender(level,mtmp);
        uVar14 = 0;
        pline("The amount %scovers %s recent losses.",pcVar11,genders[iVar6].his);
        if (0 < lVar15) {
          uVar14 = (undefined4)lVar15;
        }
        mtmp[0x1b].mtame = (char)uVar14;
        mtmp[0x1b].m_ap_type = (char)((uint)uVar14 >> 8);
        mtmp[0x1b].mfrozen = (char)((uint)uVar14 >> 0x10);
        mtmp[0x1b].mblinded = (char)((uint)uVar14 >> 0x18);
        if (lVar15 < 1) {
          make_happy_shk(mtmp,'\0');
        }
        goto LAB_00176ce8;
      }
      if ((uVar5 >> 0x16 & 1) != 0) {
        uVar5 = (int)lVar15 + mtmp[0x1b].mappearance;
        mtmp[0x1b].mappearance = uVar5;
        pcVar11 = currency((long)(int)uVar5);
        pline("You have %ld %s in credit.",(ulong)uVar5,pcVar11);
        goto LAB_00176ce8;
      }
LAB_00176aa1:
      pcVar11 = "Thanks, scum!";
    }
    verbalize(pcVar11);
LAB_00176ce8:
    add_to_minv(mtmp,gold);
    return '\x01';
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00176a7e;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00176a75;
      }
      else {
LAB_00176a75:
        if (ublindf == (obj *)0x0) goto LAB_00176bcc;
LAB_00176a7e:
        if (ublindf->oartifact != '\x1d') goto LAB_00176bcc;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)
          ) || ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_00176bcc;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 == '\0') goto LAB_00176bcc;
    uVar7 = *(uint *)&mtmp->field_0x60;
  }
  if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar7 & 0x280) != 0) goto LAB_00176bcc;
  }
  else if (((uVar7 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00176bcc;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar11 = xname(gold);
    pcVar9 = otense(gold,"hit");
    pcVar10 = mon_nam(mtmp);
    pline("The %s harmlessly %s %s.",pcVar11,pcVar9,pcVar10);
    return '\0';
  }
LAB_00176bcc:
  pcVar11 = xname(gold);
  miss(pcVar11,mtmp);
  return '\0';
}

Assistant:

boolean ghitm(struct monst *mtmp, struct obj *gold)
{
	boolean msg_given = FALSE;

	if (touch_disintegrates(mtmp->data) && !mtmp->mcan && mtmp->mhp > 6 &&
		!oresist_disintegration(gold)) {
	    if (cansee(mtmp->mx, mtmp->my))
		pline("The %s %s!", xname(gold), vtense(xname(gold),"disintegrate"));
	    dealloc_obj(gold);
	    return TRUE;
	}

	if (!likes_gold(mtmp->data) && !mtmp->isshk && !mtmp->ispriest
			&& !is_mercenary(mtmp->data)) {
		wakeup(mtmp);
	} else if (!mtmp->mcanmove) {
		/* too light to do real damage */
		if (canseemon(level, mtmp)) {
		    pline("The %s harmlessly %s %s.", xname(gold),
			      otense(gold, "hit"), mon_nam(mtmp));
		    msg_given = TRUE;
		}
	} else {
                long value = gold->quan * objects[gold->otyp].oc_cost;

		mtmp->msleeping = 0;
		mtmp->meating = 0;
		if (!rn2(4)) setmangry(mtmp); /* not always pleasing */

		/* greedy monsters catch gold */
		if (cansee(mtmp->mx, mtmp->my))
		    pline("%s catches the gold.", Monnam(mtmp));
		if (mtmp->isshk) {
			long robbed = ESHK(mtmp)->robbed;

			if (robbed) {
				robbed -= value;
				if (robbed < 0) robbed = 0;
				pline("The amount %scovers %s recent losses.",
				      !robbed ? "" : "partially ",
				      mhis(level, mtmp));
				ESHK(mtmp)->robbed = robbed;
				if (!robbed)
					make_happy_shk(mtmp, FALSE);
			} else {
				if (mtmp->mpeaceful) {
				    ESHK(mtmp)->credit += value;
				    pline("You have %ld %s in credit.",
					ESHK(mtmp)->credit,
					currency(ESHK(mtmp)->credit));
				} else verbalize("Thanks, scum!");
			}
		} else if (mtmp->ispriest) {
			if (mtmp->mpeaceful)
			    verbalize("Thank you for your contribution.");
			else verbalize("Thanks, scum!");
		} else if (is_mercenary(mtmp->data)) {
		    long goldreqd = 0L;

		    if (rn2(3)) {
			if (mtmp->data == &mons[PM_SOLDIER])
			   goldreqd = 100L;
			else if (mtmp->data == &mons[PM_SERGEANT])
			   goldreqd = 250L;
			else if (mtmp->data == &mons[PM_LIEUTENANT])
			   goldreqd = 500L;
			else if (mtmp->data == &mons[PM_CAPTAIN])
			   goldreqd = 750L;
			else if (mtmp->data == &mons[PM_PRISON_GUARD])
			   goldreqd = 200L;

			if (goldreqd) {
			   if (value > goldreqd +
				(money_cnt(invent) + u.ulevel*rn2(5))/ACURR(A_CHA))
			    mtmp->mpeaceful = TRUE;
			}
		     }
		     if (mtmp->mpeaceful)
			    verbalize("That should do.  Now beat it!");
		     else verbalize("That's not enough, coward!");
		}

		add_to_minv(mtmp, gold);
		return TRUE;
	}

	if (!msg_given) miss(xname(gold), mtmp);
	return FALSE;
}